

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestCaseRegistry::RegisterTests(ParameterizedTestCaseRegistry *this)

{
  bool bVar1;
  reference ppPVar2;
  __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
  local_20;
  __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
  local_18;
  iterator it;
  ParameterizedTestCaseRegistry *this_local;
  
  it._M_current = (ParameterizedTestCaseInfoBase **)this;
  local_18._M_current =
       (ParameterizedTestCaseInfoBase **)
       std::
       vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
       ::begin(&this->test_case_infos_);
  while( true ) {
    local_20._M_current =
         (ParameterizedTestCaseInfoBase **)
         std::
         vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
         ::end(&this->test_case_infos_);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
              ::operator*(&local_18);
    (**(code **)(*(long *)*ppPVar2 + 0x20))();
    __gnu_cxx::
    __normal_iterator<testing::internal::ParameterizedTestCaseInfoBase_**,_std::vector<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void RegisterTests() {
    for (TestCaseInfoContainer::iterator it = test_case_infos_.begin();
         it != test_case_infos_.end(); ++it) {
      (*it)->RegisterTests();
    }
  }